

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cipher.cc
# Opt level: O3

size_t bssl::ssl_cipher_get_record_split_len(SSL_CIPHER *cipher)

{
  uint32_t uVar1;
  size_t sVar2;
  
  uVar1 = cipher->algorithm_enc;
  if (uVar1 == 1) {
    sVar2 = 0x18;
  }
  else {
    if ((uVar1 != 4) && (uVar1 != 2)) {
      return 0;
    }
    sVar2 = 0x20;
  }
  if (cipher->algorithm_mac == 1) {
    return sVar2;
  }
  __assert_fail("cipher->algorithm_mac == SSL_SHA1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cipher.cc"
                ,0x4d1,"size_t bssl::ssl_cipher_get_record_split_len(const SSL_CIPHER *)");
}

Assistant:

size_t ssl_cipher_get_record_split_len(const SSL_CIPHER *cipher) {
  size_t block_size;
  switch (cipher->algorithm_enc) {
    case SSL_3DES:
      block_size = 8;
      break;
    case SSL_AES128:
    case SSL_AES256:
      block_size = 16;
      break;
    default:
      return 0;
  }

  // All supported TLS 1.0 ciphers use SHA-1.
  assert(cipher->algorithm_mac == SSL_SHA1);
  size_t ret = 1 + SHA_DIGEST_LENGTH;
  ret += block_size - (ret % block_size);
  return ret;
}